

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

_Bool ts_lex_keywords(TSLexer *lexer,TSStateId state)

{
  uint uVar1;
  ulong uVar2;
  _Bool _Var3;
  long lVar4;
  ulong uVar5;
  bool bVar6;
  
  do {
    uVar1 = lexer->lookahead;
    (*lexer->eof)(lexer);
    switch(state) {
    case 0:
      if (uVar1 == 0x51) {
        lVar4 = 1;
        bVar6 = false;
      }
      else {
        uVar2 = 0;
        do {
          uVar5 = uVar2;
          bVar6 = 0x1f < uVar5;
          if (bVar6) goto LAB_00104562;
          uVar2 = uVar5 + 2;
        } while (uVar1 != ts_lex_keywords::map[uVar5 + 2]);
        lVar4 = uVar5 + 3;
      }
      state = ts_lex_keywords::map[lVar4];
LAB_00104562:
      if (!bVar6) goto LAB_0010459b;
      _Var3 = true;
      state = 0;
      if ((4 < uVar1 - 9) && (uVar1 != 0x20)) {
        return false;
      }
      break;
    case 1:
      state = 0x12;
      _Var3 = false;
      if (uVar1 != 0x55) {
        return false;
      }
      break;
    case 2:
      state = 0x13;
      _Var3 = false;
      if (uVar1 != 0x6e) {
        if (uVar1 != 0x74) {
          return false;
        }
        state = 0x14;
        goto LAB_0010459b;
      }
      break;
    case 3:
      state = 0x15;
      goto LAB_001043b1;
    case 4:
      state = 0x16;
      goto LAB_0010434c;
    case 5:
      state = 0x17;
      goto LAB_0010434c;
    case 6:
      state = 0x18;
      _Var3 = false;
      if (uVar1 != 0x6c) {
        if (uVar1 != 0x6e) {
          return false;
        }
        state = 0x19;
        goto LAB_0010459b;
      }
      break;
    case 7:
      _Var3 = false;
      if ((int)uVar1 < 0x6f) {
        state = 0x1a;
        if (uVar1 == 0x61) break;
        if (uVar1 != 0x69) {
          return false;
        }
        state = 0x1b;
      }
      else if (uVar1 == 0x6f) {
        state = 0x1c;
      }
      else {
        if (uVar1 != 0x75) {
          return false;
        }
        state = 0x1d;
      }
      goto LAB_0010459b;
    case 8:
      state = 0x1e;
      _Var3 = false;
      if (uVar1 != 0x66) {
        if (uVar1 != 0x6e) {
          return false;
        }
        state = 0x1f;
        goto LAB_0010459b;
      }
      break;
    case 9:
      state = 0x20;
      goto LAB_0010434c;
    case 10:
      state = 0x21;
      goto LAB_0010434c;
    case 0xb:
      state = 0x22;
      goto LAB_0010434c;
    case 0xc:
      state = 0x23;
      _Var3 = false;
      if (uVar1 != 100) {
        if (uVar1 != 0x72) {
          return false;
        }
        state = 0x24;
        goto LAB_0010459b;
      }
      break;
    case 0xd:
      state = 0x25;
      goto LAB_001044a1;
    case 0xe:
      state = 0x26;
      goto LAB_00104444;
    case 0xf:
      state = 0x27;
      _Var3 = false;
      if (uVar1 != 0x68) {
        if (uVar1 != 0x72) {
          return false;
        }
        state = 0x28;
        goto LAB_0010459b;
      }
      break;
    case 0x10:
      state = 0x29;
      goto LAB_001044d7;
    case 0x11:
      state = 0x2a;
      _Var3 = false;
      if (uVar1 != 0x68) {
        return false;
      }
      break;
    case 0x12:
      state = 0x2b;
      _Var3 = false;
      if (uVar1 != 0x49) {
        return false;
      }
      break;
    case 0x13:
      state = 0x2c;
      goto LAB_001043e4;
    case 0x14:
      state = 0x2d;
      goto LAB_0010434c;
    case 0x15:
      state = 0x2e;
      goto LAB_00104444;
    case 0x16:
      state = 0x2f;
      goto LAB_001044d7;
    case 0x17:
      lexer->result_symbol = 0xb;
LAB_001046c7:
      (*lexer->mark_end)(lexer);
      return true;
    case 0x18:
      state = 0x30;
      _Var3 = false;
      if (uVar1 != 0x69) {
        if (uVar1 != 0x73) {
          return false;
        }
        state = 0x31;
        goto LAB_0010459b;
      }
      break;
    case 0x19:
      state = 0x32;
      goto LAB_001043e4;
    case 0x1a:
      state = 0x33;
      _Var3 = false;
      if (uVar1 != 0x69) {
        if (uVar1 != 0x6c) {
          return false;
        }
        state = 0x34;
        goto LAB_0010459b;
      }
      break;
    case 0x1b:
      lexer->result_symbol = 7;
      goto LAB_001046c7;
    case 0x1c:
      state = 0x35;
      goto LAB_001043b1;
    case 0x1d:
      state = 0x36;
      goto LAB_001044d7;
    case 0x1e:
      lexer->result_symbol = 5;
      goto LAB_001046c7;
    case 0x1f:
      lexer->result_symbol = 0x10;
      goto LAB_001046c7;
    case 0x20:
      state = 0x37;
      goto LAB_00104459;
    case 0x21:
      state = 0x38;
      goto LAB_001043e4;
    case 0x22:
      state = 0x39;
      goto LAB_001044b6;
    case 0x23:
      lexer->result_symbol = 0xc;
      goto LAB_001046c7;
    case 0x24:
      lexer->result_symbol = 0x1d;
      goto LAB_001046c7;
    case 0x25:
      state = 0x3a;
      goto LAB_0010450d;
    case 0x26:
      _Var3 = false;
      if ((int)uVar1 < 0x70) {
        state = 0x3b;
        if (uVar1 == 0x61) break;
        if (uVar1 != 99) {
          return false;
        }
        state = 0x3c;
      }
      else if (uVar1 == 0x70) {
        state = 0x3d;
      }
      else {
        if (uVar1 != 0x74) {
          return false;
        }
        state = 0x3e;
      }
LAB_0010459b:
      _Var3 = false;
      break;
    case 0x27:
      state = 0x3f;
      goto LAB_00104444;
    case 0x28:
      state = 0x40;
      goto LAB_001044a1;
    case 0x29:
      state = 0x41;
      goto LAB_001044b6;
    case 0x2a:
      state = 0x42;
      goto LAB_0010450d;
    case 0x2b:
      state = 0x43;
      _Var3 = false;
      if (uVar1 != 0x54) {
        return false;
      }
      break;
    case 0x2c:
      lexer->result_symbol = 0x1e;
      goto LAB_001046c7;
    case 0x2d:
      state = 0x44;
      _Var3 = false;
      if (uVar1 != 0x6d) {
        return false;
      }
      break;
    case 0x2e:
      state = 0x45;
      goto LAB_001044ec;
    case 0x2f:
      state = 0x46;
      goto LAB_001044b6;
    case 0x30:
      state = 0x47;
      _Var3 = false;
      if (uVar1 != 0x66) {
        return false;
      }
      break;
    case 0x31:
      state = 0x48;
      goto LAB_00104444;
    case 0x32:
      lexer->result_symbol = 0x37;
      goto LAB_001046c7;
    case 0x33:
      state = 0x49;
      goto LAB_00104429;
    case 0x34:
      state = 0x4a;
      _Var3 = false;
      if (uVar1 != 0x73) {
        return false;
      }
      break;
    case 0x35:
      lexer->result_symbol = 0xf;
      goto LAB_001046c7;
    case 0x36:
      state = 0x4b;
      goto LAB_00104459;
    case 0x37:
      state = 0x4c;
      goto LAB_001044ec;
    case 0x38:
      lexer->result_symbol = 0x29;
      goto LAB_001046c7;
    case 0x39:
      lexer->result_symbol = 0x2b;
      goto LAB_001046c7;
    case 0x3a:
      state = 0x43;
      goto LAB_001044b6;
    case 0x3b:
      state = 0x4d;
LAB_001043e4:
      _Var3 = false;
      if (uVar1 != 100) {
        return false;
      }
      break;
    case 0x3c:
      lexer->result_symbol = 0x3f;
      goto LAB_001046c7;
    case 0x3d:
      state = 0x4e;
      goto LAB_00104444;
    case 0x3e:
      state = 0x4f;
      goto LAB_001044a1;
    case 0x3f:
      state = 0x50;
      goto LAB_001044d7;
    case 0x40:
      state = 0x51;
      goto LAB_00104444;
    case 0x41:
      state = 0x52;
      goto LAB_0010450d;
    case 0x42:
      state = 0x53;
      goto LAB_00104429;
    case 0x43:
      lexer->result_symbol = 3;
      goto LAB_001046c7;
    case 0x44:
      state = 0x54;
      goto LAB_0010450d;
    case 0x45:
      state = 0x55;
      _Var3 = false;
      if (uVar1 != 0x6b) {
        return false;
      }
      break;
    case 0x46:
      state = 0x56;
      goto LAB_0010450d;
    case 0x47:
      lexer->result_symbol = 8;
      goto LAB_001046c7;
    case 0x48:
      lexer->result_symbol = 9;
      goto LAB_001046c7;
    case 0x49:
      lexer->result_symbol = 0x31;
      goto LAB_001046c7;
    case 0x4a:
      state = 0x57;
      goto LAB_00104444;
    case 0x4b:
      state = 0x58;
      goto LAB_001044b6;
    case 0x4c:
      state = 0x59;
      goto LAB_00104429;
    case 0x4d:
      state = 0x5a;
      _Var3 = false;
      if (uVar1 != 0x6f) {
        if (uVar1 != 0x77) {
          return false;
        }
        state = 0x5b;
        goto LAB_0010459b;
      }
      break;
    case 0x4e:
      state = 0x5c;
LAB_001044ec:
      _Var3 = false;
      if (uVar1 != 0x61) {
        return false;
      }
      break;
    case 0x4f:
      state = 0x5d;
      goto LAB_001043b1;
    case 0x50:
      lexer->result_symbol = 6;
      goto LAB_001046c7;
    case 0x51:
      lexer->result_symbol = 0x2f;
      goto LAB_001046c7;
    case 0x52:
      state = 0x5e;
      goto LAB_00104429;
    case 0x53:
      state = 0x5f;
      goto LAB_00104444;
    case 0x54:
      state = 0x60;
LAB_00104459:
      _Var3 = false;
      if (uVar1 != 99) {
        return false;
      }
      break;
    case 0x55:
      lexer->result_symbol = 0x13;
      goto LAB_001046c7;
    case 0x56:
      state = 0x61;
      goto LAB_001044d7;
    case 0x57:
      lexer->result_symbol = 0x30;
      goto LAB_001046c7;
    case 0x58:
      state = 0x62;
      goto LAB_0010450d;
    case 0x59:
      lexer->result_symbol = 0x3c;
      goto LAB_001046c7;
    case 0x5a:
      state = 99;
      goto LAB_001044d7;
    case 0x5b:
      state = 100;
LAB_001043b1:
      _Var3 = false;
      if (uVar1 != 0x72) {
        return false;
      }
      break;
    case 0x5c:
      state = 0x65;
      goto LAB_001044b6;
    case 0x5d:
      state = 0x66;
      goto LAB_001044d7;
    case 0x5e:
      lexer->result_symbol = 0xe;
      goto LAB_001046c7;
    case 0x5f:
      lexer->result_symbol = 10;
      goto LAB_001046c7;
    case 0x60:
      lexer->result_symbol = 0x11;
      goto LAB_001046c7;
    case 0x61:
      state = 0x67;
LAB_001044a1:
      _Var3 = false;
      if (uVar1 != 0x75) {
        return false;
      }
      break;
    case 0x62:
      state = 0x68;
LAB_0010434c:
      _Var3 = false;
      if (uVar1 != 0x6f) {
        return false;
      }
      break;
    case 99:
      state = 0x69;
LAB_00104429:
      _Var3 = false;
      if (uVar1 != 0x6c) {
        return false;
      }
      break;
    case 100:
      state = 0x6a;
LAB_0010450d:
      _Var3 = false;
      if (uVar1 != 0x69) {
        return false;
      }
      break;
    case 0x65:
      lexer->result_symbol = 0xd;
      goto LAB_001046c7;
    case 0x66:
      lexer->result_symbol = 0x15;
      goto LAB_001046c7;
    case 0x67:
      state = 0x6b;
      goto LAB_00104444;
    case 0x68:
      state = 0x6c;
LAB_001044d7:
      _Var3 = false;
      if (uVar1 != 0x6e) {
        return false;
      }
      break;
    case 0x69:
      state = 0x6d;
      _Var3 = false;
      if (uVar1 != 0x79) {
        return false;
      }
      break;
    case 0x6a:
      state = 0x6e;
LAB_001044b6:
      _Var3 = false;
      if (uVar1 != 0x74) {
        return false;
      }
      break;
    case 0x6b:
      lexer->result_symbol = 0x14;
      goto LAB_001046c7;
    case 0x6c:
      lexer->result_symbol = 0x36;
      goto LAB_001046c7;
    case 0x6d:
      lexer->result_symbol = 0x40;
      goto LAB_001046c7;
    case 0x6e:
      state = 0x6f;
LAB_00104444:
      _Var3 = false;
      if (uVar1 != 0x65) {
        return false;
      }
      break;
    case 0x6f:
      lexer->result_symbol = 0x41;
      goto LAB_001046c7;
    default:
      return false;
    }
    (*lexer->advance)(lexer,_Var3);
  } while( true );
}

Assistant:

static bool ts_lex_keywords(TSLexer *lexer, TSStateId state) {
  START_LEXER();
  eof = lexer->eof(lexer);
  switch (state) {
    case 0:
      ADVANCE_MAP(
        'Q', 1,
        'a', 2,
        'b', 3,
        'c', 4,
        'd', 5,
        'e', 6,
        'f', 7,
        'i', 8,
        'l', 9,
        'm', 10,
        'n', 11,
        'o', 12,
        'q', 13,
        'r', 14,
        't', 15,
        'u', 16,
        'w', 17,
      );
      if (('\t' <= lookahead && lookahead <= '\r') ||
          lookahead == ' ') SKIP(0);
      END_STATE();
    case 1:
      if (lookahead == 'U') ADVANCE(18);
      END_STATE();
    case 2:
      if (lookahead == 'n') ADVANCE(19);
      if (lookahead == 't') ADVANCE(20);
      END_STATE();
    case 3:
      if (lookahead == 'r') ADVANCE(21);
      END_STATE();
    case 4:
      if (lookahead == 'o') ADVANCE(22);
      END_STATE();
    case 5:
      if (lookahead == 'o') ADVANCE(23);
      END_STATE();
    case 6:
      if (lookahead == 'l') ADVANCE(24);
      if (lookahead == 'n') ADVANCE(25);
      END_STATE();
    case 7:
      if (lookahead == 'a') ADVANCE(26);
      if (lookahead == 'i') ADVANCE(27);
      if (lookahead == 'o') ADVANCE(28);
      if (lookahead == 'u') ADVANCE(29);
      END_STATE();
    case 8:
      if (lookahead == 'f') ADVANCE(30);
      if (lookahead == 'n') ADVANCE(31);
      END_STATE();
    case 9:
      if (lookahead == 'o') ADVANCE(32);
      END_STATE();
    case 10:
      if (lookahead == 'o') ADVANCE(33);
      END_STATE();
    case 11:
      if (lookahead == 'o') ADVANCE(34);
      END_STATE();
    case 12:
      if (lookahead == 'd') ADVANCE(35);
      if (lookahead == 'r') ADVANCE(36);
      END_STATE();
    case 13:
      if (lookahead == 'u') ADVANCE(37);
      END_STATE();
    case 14:
      if (lookahead == 'e') ADVANCE(38);
      END_STATE();
    case 15:
      if (lookahead == 'h') ADVANCE(39);
      if (lookahead == 'r') ADVANCE(40);
      END_STATE();
    case 16:
      if (lookahead == 'n') ADVANCE(41);
      END_STATE();
    case 17:
      if (lookahead == 'h') ADVANCE(42);
      END_STATE();
    case 18:
      if (lookahead == 'I') ADVANCE(43);
      END_STATE();
    case 19:
      if (lookahead == 'd') ADVANCE(44);
      END_STATE();
    case 20:
      if (lookahead == 'o') ADVANCE(45);
      END_STATE();
    case 21:
      if (lookahead == 'e') ADVANCE(46);
      END_STATE();
    case 22:
      if (lookahead == 'n') ADVANCE(47);
      END_STATE();
    case 23:
      ACCEPT_TOKEN(anon_sym_do);
      END_STATE();
    case 24:
      if (lookahead == 'i') ADVANCE(48);
      if (lookahead == 's') ADVANCE(49);
      END_STATE();
    case 25:
      if (lookahead == 'd') ADVANCE(50);
      END_STATE();
    case 26:
      if (lookahead == 'i') ADVANCE(51);
      if (lookahead == 'l') ADVANCE(52);
      END_STATE();
    case 27:
      ACCEPT_TOKEN(anon_sym_fi);
      END_STATE();
    case 28:
      if (lookahead == 'r') ADVANCE(53);
      END_STATE();
    case 29:
      if (lookahead == 'n') ADVANCE(54);
      END_STATE();
    case 30:
      ACCEPT_TOKEN(anon_sym_if);
      END_STATE();
    case 31:
      ACCEPT_TOKEN(anon_sym_in);
      END_STATE();
    case 32:
      if (lookahead == 'c') ADVANCE(55);
      END_STATE();
    case 33:
      if (lookahead == 'd') ADVANCE(56);
      END_STATE();
    case 34:
      if (lookahead == 't') ADVANCE(57);
      END_STATE();
    case 35:
      ACCEPT_TOKEN(anon_sym_od);
      END_STATE();
    case 36:
      ACCEPT_TOKEN(anon_sym_or);
      END_STATE();
    case 37:
      if (lookahead == 'i') ADVANCE(58);
      END_STATE();
    case 38:
      if (lookahead == 'a') ADVANCE(59);
      if (lookahead == 'c') ADVANCE(60);
      if (lookahead == 'p') ADVANCE(61);
      if (lookahead == 't') ADVANCE(62);
      END_STATE();
    case 39:
      if (lookahead == 'e') ADVANCE(63);
      END_STATE();
    case 40:
      if (lookahead == 'u') ADVANCE(64);
      END_STATE();
    case 41:
      if (lookahead == 't') ADVANCE(65);
      END_STATE();
    case 42:
      if (lookahead == 'i') ADVANCE(66);
      END_STATE();
    case 43:
      if (lookahead == 'T') ADVANCE(67);
      END_STATE();
    case 44:
      ACCEPT_TOKEN(anon_sym_and);
      END_STATE();
    case 45:
      if (lookahead == 'm') ADVANCE(68);
      END_STATE();
    case 46:
      if (lookahead == 'a') ADVANCE(69);
      END_STATE();
    case 47:
      if (lookahead == 't') ADVANCE(70);
      END_STATE();
    case 48:
      if (lookahead == 'f') ADVANCE(71);
      END_STATE();
    case 49:
      if (lookahead == 'e') ADVANCE(72);
      END_STATE();
    case 50:
      ACCEPT_TOKEN(anon_sym_end);
      END_STATE();
    case 51:
      if (lookahead == 'l') ADVANCE(73);
      END_STATE();
    case 52:
      if (lookahead == 's') ADVANCE(74);
      END_STATE();
    case 53:
      ACCEPT_TOKEN(anon_sym_for);
      END_STATE();
    case 54:
      if (lookahead == 'c') ADVANCE(75);
      END_STATE();
    case 55:
      if (lookahead == 'a') ADVANCE(76);
      END_STATE();
    case 56:
      ACCEPT_TOKEN(anon_sym_mod);
      END_STATE();
    case 57:
      ACCEPT_TOKEN(anon_sym_not);
      END_STATE();
    case 58:
      if (lookahead == 't') ADVANCE(67);
      END_STATE();
    case 59:
      if (lookahead == 'd') ADVANCE(77);
      END_STATE();
    case 60:
      ACCEPT_TOKEN(anon_sym_rec);
      END_STATE();
    case 61:
      if (lookahead == 'e') ADVANCE(78);
      END_STATE();
    case 62:
      if (lookahead == 'u') ADVANCE(79);
      END_STATE();
    case 63:
      if (lookahead == 'n') ADVANCE(80);
      END_STATE();
    case 64:
      if (lookahead == 'e') ADVANCE(81);
      END_STATE();
    case 65:
      if (lookahead == 'i') ADVANCE(82);
      END_STATE();
    case 66:
      if (lookahead == 'l') ADVANCE(83);
      END_STATE();
    case 67:
      ACCEPT_TOKEN(sym_quit_statement);
      END_STATE();
    case 68:
      if (lookahead == 'i') ADVANCE(84);
      END_STATE();
    case 69:
      if (lookahead == 'k') ADVANCE(85);
      END_STATE();
    case 70:
      if (lookahead == 'i') ADVANCE(86);
      END_STATE();
    case 71:
      ACCEPT_TOKEN(anon_sym_elif);
      END_STATE();
    case 72:
      ACCEPT_TOKEN(anon_sym_else);
      END_STATE();
    case 73:
      ACCEPT_TOKEN(anon_sym_fail);
      END_STATE();
    case 74:
      if (lookahead == 'e') ADVANCE(87);
      END_STATE();
    case 75:
      if (lookahead == 't') ADVANCE(88);
      END_STATE();
    case 76:
      if (lookahead == 'l') ADVANCE(89);
      END_STATE();
    case 77:
      if (lookahead == 'o') ADVANCE(90);
      if (lookahead == 'w') ADVANCE(91);
      END_STATE();
    case 78:
      if (lookahead == 'a') ADVANCE(92);
      END_STATE();
    case 79:
      if (lookahead == 'r') ADVANCE(93);
      END_STATE();
    case 80:
      ACCEPT_TOKEN(anon_sym_then);
      END_STATE();
    case 81:
      ACCEPT_TOKEN(anon_sym_true);
      END_STATE();
    case 82:
      if (lookahead == 'l') ADVANCE(94);
      END_STATE();
    case 83:
      if (lookahead == 'e') ADVANCE(95);
      END_STATE();
    case 84:
      if (lookahead == 'c') ADVANCE(96);
      END_STATE();
    case 85:
      ACCEPT_TOKEN(sym_break_statement);
      END_STATE();
    case 86:
      if (lookahead == 'n') ADVANCE(97);
      END_STATE();
    case 87:
      ACCEPT_TOKEN(anon_sym_false);
      END_STATE();
    case 88:
      if (lookahead == 'i') ADVANCE(98);
      END_STATE();
    case 89:
      ACCEPT_TOKEN(anon_sym_local);
      END_STATE();
    case 90:
      if (lookahead == 'n') ADVANCE(99);
      END_STATE();
    case 91:
      if (lookahead == 'r') ADVANCE(100);
      END_STATE();
    case 92:
      if (lookahead == 't') ADVANCE(101);
      END_STATE();
    case 93:
      if (lookahead == 'n') ADVANCE(102);
      END_STATE();
    case 94:
      ACCEPT_TOKEN(anon_sym_until);
      END_STATE();
    case 95:
      ACCEPT_TOKEN(anon_sym_while);
      END_STATE();
    case 96:
      ACCEPT_TOKEN(anon_sym_atomic);
      END_STATE();
    case 97:
      if (lookahead == 'u') ADVANCE(103);
      END_STATE();
    case 98:
      if (lookahead == 'o') ADVANCE(104);
      END_STATE();
    case 99:
      if (lookahead == 'l') ADVANCE(105);
      END_STATE();
    case 100:
      if (lookahead == 'i') ADVANCE(106);
      END_STATE();
    case 101:
      ACCEPT_TOKEN(anon_sym_repeat);
      END_STATE();
    case 102:
      ACCEPT_TOKEN(anon_sym_return);
      END_STATE();
    case 103:
      if (lookahead == 'e') ADVANCE(107);
      END_STATE();
    case 104:
      if (lookahead == 'n') ADVANCE(108);
      END_STATE();
    case 105:
      if (lookahead == 'y') ADVANCE(109);
      END_STATE();
    case 106:
      if (lookahead == 't') ADVANCE(110);
      END_STATE();
    case 107:
      ACCEPT_TOKEN(sym_continue_statement);
      END_STATE();
    case 108:
      ACCEPT_TOKEN(anon_sym_function);
      END_STATE();
    case 109:
      ACCEPT_TOKEN(anon_sym_readonly);
      END_STATE();
    case 110:
      if (lookahead == 'e') ADVANCE(111);
      END_STATE();
    case 111:
      ACCEPT_TOKEN(anon_sym_readwrite);
      END_STATE();
    default:
      return false;
  }
}